

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# funchook.c
# Opt level: O2

int funchook_uninstall(funchook_t *funchook,int flags)

{
  undefined4 *puVar1;
  uint uVar2;
  int i;
  ulong uVar3;
  funchook_entry_t *pfVar4;
  funchook_page_t *page;
  mem_state_t local_40;
  
  funchook_log(funchook,"Enter funchook_uninstall(%p, 0x%x)\n",funchook,flags);
  if (funchook->installed == 0) {
    uVar2 = 10;
  }
  else {
    page = (funchook_page_t *)&funchook->page_list;
    while (page = page->next, page != (funchook_page_t *)0x0) {
      pfVar4 = page->entries;
      for (uVar3 = 0; uVar3 < page->used; uVar3 = uVar3 + 1) {
        uVar2 = funchook_unprotect_begin(funchook,&local_40,pfVar4->target_func,5);
        if (uVar2 != 0) goto LAB_00101793;
        puVar1 = (undefined4 *)pfVar4->target_func;
        *(uint8_t *)(puVar1 + 1) = pfVar4->old_code[4];
        *puVar1 = *(undefined4 *)pfVar4->old_code;
        uVar2 = funchook_unprotect_end(funchook,&local_40);
        if (uVar2 != 0) goto LAB_00101793;
        pfVar4 = pfVar4 + 1;
      }
      funchook_page_unprotect(funchook,page);
    }
    funchook->installed = 0;
    uVar2 = 0;
  }
LAB_00101793:
  funchook_log_end((funchook_t *)0x0,"Leave funchook_uninstall() => %d\n",(ulong)uVar2);
  return uVar2;
}

Assistant:

int funchook_uninstall(funchook_t *funchook, int flags)
{
    int rv;

    funchook_log(funchook, "Enter funchook_uninstall(%p, 0x%x)\n", funchook, flags);
    rv = funchook_uninstall_internal(funchook, flags);
    funchook_log_end(NULL, "Leave funchook_uninstall() => %d\n", rv);
    return rv;
}